

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

bool __thiscall QSplitter::restoreState(QSplitter *this,QByteArray *state)

{
  QSplitterPrivate *this_00;
  QSplitterPrivate *this_01;
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool bVar3;
  qint32 v;
  qint32 marker;
  qint32 i;
  bool b;
  int local_98;
  int local_94;
  Orientation local_90;
  bool local_89;
  QList<int> local_88;
  QArrayData *local_70;
  char *local_68;
  qsizetype local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  local_70 = &((state->d).d)->super_QArrayData;
  local_68 = (state->d).ptr;
  local_60 = (state->d).size;
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_70,1);
  uStack_40 = 0xd;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (int *)0x0;
  local_88.d.size = 0;
  local_89 = true;
  local_90 = 0xaaaaaaaa;
  local_94 = -0x55555556;
  local_98 = -0x55555556;
  QDataStream::operator>>((QDataStream *)&local_58,&local_94);
  QDataStream::operator>>((QDataStream *)&local_58,&local_98);
  bVar3 = local_94 == 0xff;
  bVar2 = local_98 < 2;
  if (bVar2 && bVar3) {
    QtPrivate::readArrayBasedContainer<QList<int>>((QDataStream *)&local_58,&local_88);
    QSplitterPrivate::setSizes_helper(this_00,&local_88,false);
    QDataStream::operator>>((QDataStream *)&local_58,&local_89);
    *(bool *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x2a6) = local_89;
    QDataStream::operator>>((QDataStream *)&local_58,(int *)&local_90);
    this_01 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
    this_01->handleWidth = local_90;
    QSplitterPrivate::recalc
              (this_01,SUB21((ushort)*(undefined2 *)
                                      (*(long *)(*(long *)&(this_01->super_QFramePrivate).
                                                           super_QWidgetPrivate.field_0x8 + 0x20) +
                                      8) >> 0xf,0));
    QDataStream::operator>>((QDataStream *)&local_58,&local_89);
    lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
    *(undefined1 *)(lVar1 + 0x2ad) = 1;
    *(bool *)(lVar1 + 0x2a4) = local_89;
    QDataStream::operator>>((QDataStream *)&local_58,(int *)&local_90);
    setOrientation(this,local_90);
    QSplitterPrivate::doResize(this_00);
    if (0 < local_98) {
      QDataStream::operator>>((QDataStream *)&local_58,&this_00->opaqueResizeSet);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
    }
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2 && bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSplitter::restoreState(const QByteArray &state)
{
    Q_D(QSplitter);
    int version = 1;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    QList<int> list;
    bool b;
    qint32 i;
    qint32 marker;
    qint32 v;

    stream >> marker;
    stream >> v;
    if (marker != SplitterMagic || v > version)
        return false;

    stream >> list;
    d->setSizes_helper(list, false);

    stream >> b;
    setChildrenCollapsible(b);

    stream >> i;
    setHandleWidth(i);

    stream >> b;
    setOpaqueResize(b);

    stream >> i;
    setOrientation(Qt::Orientation(i));
    d->doResize();

    if (v >= 1)
        stream >> d->opaqueResizeSet;

    return true;
}